

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O3

gnode_t * parse_variable_declaration
                    (gravity_parser_t *parser,_Bool isstatement,gtoken_t access_specifier,
                    gtoken_t storage_specifier)

{
  gravity_lexer_t *pgVar1;
  gravity_delegate_t *pgVar2;
  gravity_lexer_t *lexer;
  gtoken_s token_00;
  gtoken_s token_01;
  gtoken_s token_02;
  gtoken_s token_03;
  gtoken_s token_04;
  gtoken_s token_05;
  gtoken_s token_06;
  _Bool _Var3;
  gtoken_t gVar4;
  int iVar5;
  gnode_variable_decl_t *vdecl;
  gnode_r *pgVar6;
  char *pcVar7;
  char *annotation_type;
  uint16_t *__ptr;
  gnode_t *pgVar8;
  char *__s1;
  char *pcVar9;
  gnode_t *pgVar10;
  gnode_t *pgVar11;
  gnode_r *pgVar12;
  gnode_t **ppgVar13;
  gnode_t *pgVar14;
  undefined1 uVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  bool bVar19;
  gtoken_s token_block;
  gtoken_s token2;
  gtoken_s token_1;
  gtoken_s token;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined8 local_190;
  undefined4 uStack_188;
  int iStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  char *local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  char *local_148;
  undefined8 local_140;
  undefined4 uStack_138;
  int iStack_134;
  undefined4 local_130;
  int iStack_12c;
  undefined8 uStack_128;
  char *local_120;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  char *local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  char *local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  char *local_68;
  
  pgVar1 = parser->lexer->p[parser->lexer->n - 1];
  gVar4 = gravity_lexer_next(pgVar1);
  _Var3 = token_isvariable_declaration(gVar4);
  if (_Var3) {
    gravity_lexer_token(pgVar1);
    sVar17 = parser->declarations->n;
    if (sVar17 == 0) {
      pgVar8 = (gnode_t *)0x0;
    }
    else {
      pgVar8 = parser->declarations->p[sVar17 - 1];
    }
    uVar20 = (undefined4)((ulong)local_180 >> 0x20);
    uVar21 = (undefined4)((ulong)uStack_178 >> 0x20);
    token_00.colno = uStack_188;
    token_00._0_8_ = local_190;
    token_00.position = iStack_184;
    token_00.bytes = (int)local_180;
    token_00.length = uVar20;
    token_00.fileid = (int)uStack_178;
    token_00.builtin = uVar21;
    token_00.value = local_170;
    vdecl = (gnode_variable_decl_t *)
            gnode_variable_decl_create
                      (token_00,gVar4,access_specifier,storage_specifier,(gnode_r *)0x0,pgVar8);
    pgVar6 = gnode_array_create();
    pcVar7 = parse_identifier(parser);
    while (pcVar7 != (char *)0x0) {
      gravity_lexer_token(pgVar1);
      local_148 = local_170;
      uStack_160 = CONCAT44(iStack_184,uStack_188);
      local_158 = local_180;
      uStack_150 = uStack_178;
      local_168 = local_190;
      annotation_type = parse_optional_type_annotation(parser);
      if (((annotation_type != (char *)0x0) &&
          (pgVar2 = parser->delegate, pgVar2 != (gravity_delegate_t *)0x0)) &&
         (pgVar2->type_callback != (gravity_type_callback)0x0)) {
        (*pgVar2->type_callback)(&local_168,annotation_type,pgVar2->xdata);
      }
      gVar4 = gravity_lexer_peek(pgVar1);
      _Var3 = token_isvariable_assignment(gVar4);
      if (_Var3) {
        gravity_lexer_next(pgVar1);
        sVar17 = (parser->vdecl).n;
        __ptr = (parser->vdecl).p;
        if (sVar17 == (parser->vdecl).m) {
          sVar16 = sVar17 * 2;
          if (sVar17 == 0) {
            sVar16 = 8;
          }
          (parser->vdecl).m = sVar16;
          __ptr = (uint16_t *)realloc(__ptr,sVar16 * 2);
          (parser->vdecl).p = __ptr;
          sVar17 = (parser->vdecl).n;
        }
        (parser->vdecl).n = sVar17 + 1;
        __ptr[sVar17] = 1;
        uVar15 = 0;
        pgVar8 = parse_precedence(parser,PREC_LOWEST);
        (parser->vdecl).n = (parser->vdecl).n - 1;
      }
      else if (gVar4 == TOK_OP_OPEN_CURLYBRACE) {
        gravity_lexer_next(pgVar1);
        lexer = parser->lexer->p[parser->lexer->n - 1];
        gravity_lexer_token(lexer);
        gVar4 = gravity_lexer_peek(lexer);
        if (gVar4 == TOK_OP_CLOSED_CURLYBRACE) {
          pgVar8 = (gnode_t *)0x0;
          pgVar14 = (gnode_t *)0x0;
        }
        else {
          pgVar14 = (gnode_t *)0x0;
          pgVar8 = (gnode_t *)0x0;
          do {
            __s1 = parse_identifier(parser);
            if (__s1 == (char *)0x0) {
              pgVar8 = (gnode_t *)0x0;
              goto LAB_00111f40;
            }
            gravity_lexer_token(lexer);
            iVar5 = strcmp(__s1,"get");
            bVar19 = iVar5 == 0;
            if (bVar19) {
              pgVar12 = gnode_array_create();
              sVar17 = pgVar12->n;
              if (sVar17 == pgVar12->m) {
                sVar16 = sVar17 * 2;
                if (sVar17 == 0) {
                  sVar16 = 8;
                }
                pgVar12->m = sVar16;
                ppgVar13 = (gnode_t **)realloc(pgVar12->p,sVar16 << 3);
                pgVar12->p = ppgVar13;
              }
              local_78 = 0;
              uStack_70 = 0;
              local_88 = 0;
              uStack_80 = 0;
              local_68 = (char *)0x0;
              pcVar9 = string_dup("self");
              sVar17 = parser->declarations->n;
              if (sVar17 == 0) {
                pgVar10 = (gnode_t *)0x0;
              }
              else {
                pgVar10 = parser->declarations->p[sVar17 - 1];
              }
              token_01.colno = (int)uStack_80;
              token_01.type = (undefined4)local_88;
              token_01.lineno = local_88._4_4_;
              token_01.position = (int)((ulong)uStack_80 >> 0x20);
              token_01.bytes = (int)local_78;
              token_01.length = (int)((ulong)local_78 >> 0x20);
              token_01.fileid = (int)uStack_70;
              token_01.builtin = (int)((ulong)uStack_70 >> 0x20);
              token_01.value = local_68;
              pgVar10 = gnode_variable_create
                                  (token_01,pcVar9,(char *)0x0,(gnode_t *)0x0,pgVar10,
                                   (gnode_variable_decl_t *)0x0);
              sVar17 = pgVar12->n;
              pgVar12->n = sVar17 + 1;
              pgVar12->p[sVar17] = pgVar10;
            }
            else {
              pgVar12 = (gnode_r *)0x0;
            }
            iVar5 = strcmp(__s1,"set");
            if (iVar5 == 0) {
              gVar4 = gravity_lexer_peek(lexer);
              if (gVar4 == TOK_OP_OPEN_PARENTHESIS) {
                parse_required(parser,TOK_OP_OPEN_PARENTHESIS);
                bVar19 = false;
                pgVar12 = parse_optional_parameter_declaration(parser,false,(_Bool *)0x0);
                parse_required(parser,TOK_OP_CLOSED_PARENTHESIS);
              }
              else {
                pgVar12 = gnode_array_create();
                sVar17 = pgVar12->n;
                if (sVar17 == pgVar12->m) {
                  sVar16 = sVar17 * 2;
                  if (sVar17 == 0) {
                    sVar16 = 8;
                  }
                  pgVar12->m = sVar16;
                  ppgVar13 = (gnode_t **)realloc(pgVar12->p,sVar16 << 3);
                  pgVar12->p = ppgVar13;
                }
                local_a8 = 0;
                uStack_a0 = 0;
                local_b8 = 0;
                uStack_b0 = 0;
                local_98 = (char *)0x0;
                pcVar9 = string_dup("self");
                sVar17 = parser->declarations->n;
                if (sVar17 == 0) {
                  pgVar10 = (gnode_t *)0x0;
                }
                else {
                  pgVar10 = parser->declarations->p[sVar17 - 1];
                }
                token_02.colno = (int)uStack_b0;
                token_02.type = (undefined4)local_b8;
                token_02.lineno = local_b8._4_4_;
                token_02.position = (int)((ulong)uStack_b0 >> 0x20);
                token_02.bytes = (int)local_a8;
                token_02.length = (int)((ulong)local_a8 >> 0x20);
                token_02.fileid = (int)uStack_a0;
                token_02.builtin = (int)((ulong)uStack_a0 >> 0x20);
                token_02.value = local_98;
                pgVar10 = gnode_variable_create
                                    (token_02,pcVar9,(char *)0x0,(gnode_t *)0x0,pgVar10,
                                     (gnode_variable_decl_t *)0x0);
                sVar16 = pgVar12->n;
                sVar17 = sVar16 + 1;
                pgVar12->n = sVar17;
                pgVar12->p[sVar16] = pgVar10;
                if (sVar17 == pgVar12->m) {
                  sVar16 = sVar17 * 2;
                  if (sVar17 == 0) {
                    sVar16 = 8;
                  }
                  pgVar12->m = sVar16;
                  ppgVar13 = (gnode_t **)realloc(pgVar12->p,sVar16 << 3);
                  pgVar12->p = ppgVar13;
                }
                local_d8 = 0;
                uStack_d0 = 0;
                local_e8 = 0;
                uStack_e0 = 0;
                local_c8 = (char *)0x0;
                pcVar9 = string_dup("value");
                sVar17 = parser->declarations->n;
                if (sVar17 == 0) {
                  pgVar10 = (gnode_t *)0x0;
                }
                else {
                  pgVar10 = parser->declarations->p[sVar17 - 1];
                }
                bVar19 = false;
                token_03.colno = (int)uStack_e0;
                token_03.type = (undefined4)local_e8;
                token_03.lineno = local_e8._4_4_;
                token_03.position = (int)((ulong)uStack_e0 >> 0x20);
                token_03.bytes = (int)local_d8;
                token_03.length = (int)((ulong)local_d8 >> 0x20);
                token_03.fileid = (int)uStack_d0;
                token_03.builtin = (int)((ulong)uStack_d0 >> 0x20);
                token_03.value = local_c8;
                pgVar10 = gnode_variable_create
                                    (token_03,pcVar9,(char *)0x0,(gnode_t *)0x0,pgVar10,
                                     (gnode_variable_decl_t *)0x0);
                sVar17 = pgVar12->n;
                pgVar12->n = sVar17 + 1;
                pgVar12->p[sVar17] = pgVar10;
              }
            }
            free(__s1);
            sVar17 = parser->declarations->n;
            if (sVar17 == 0) {
              pgVar10 = (gnode_t *)0x0;
            }
            else {
              pgVar10 = parser->declarations->p[sVar17 - 1];
            }
            token_04.colno = uStack_138;
            token_04.type = (undefined4)local_140;
            token_04.lineno = local_140._4_4_;
            token_04.position = iStack_134;
            token_04.bytes = local_130;
            token_04.length = iStack_12c;
            token_04.fileid = (int)uStack_128;
            token_04.builtin = (int)((ulong)uStack_128 >> 0x20);
            token_04.value = local_120;
            pgVar10 = gnode_function_decl_create
                                (token_04,(char *)0x0,TOK_EOF,TOK_EOF,pgVar12,
                                 (gnode_compound_stmt_t *)0x0,pgVar10);
            *(undefined4 *)&pgVar10[1].field_0xc = 0x22;
            pgVar12 = parser->declarations;
            sVar17 = pgVar12->n;
            if (sVar17 == pgVar12->m) {
              sVar16 = sVar17 * 2;
              if (sVar17 == 0) {
                sVar16 = 8;
              }
              pgVar12->m = sVar16;
              ppgVar13 = (gnode_t **)realloc(pgVar12->p,sVar16 << 3);
              pgVar12 = parser->declarations;
              pgVar12->p = ppgVar13;
              sVar17 = pgVar12->n;
            }
            else {
              ppgVar13 = pgVar12->p;
            }
            pgVar12->n = sVar17 + 1;
            ppgVar13[sVar17] = pgVar10;
            pgVar11 = parse_compound_statement(parser);
            parser->declarations->n = parser->declarations->n - 1;
            *(gnode_t **)&pgVar10[1].token.fileid = pgVar11;
            if (bVar19) {
              pgVar14 = pgVar10;
              pgVar10 = pgVar8;
            }
            pgVar8 = pgVar10;
            gVar4 = gravity_lexer_peek(lexer);
          } while (gVar4 != TOK_OP_CLOSED_CURLYBRACE);
        }
        pgVar12 = gnode_array_create();
        sVar17 = pgVar12->n;
        sVar16 = pgVar12->m;
        if (sVar17 == sVar16) {
          sVar16 = sVar17 * 2;
          if (sVar17 == 0) {
            sVar16 = 8;
          }
          pgVar12->m = sVar16;
          ppgVar13 = (gnode_t **)realloc(pgVar12->p,sVar16 << 3);
          pgVar12->p = ppgVar13;
          sVar17 = pgVar12->n;
          sVar16 = pgVar12->m;
        }
        else {
          ppgVar13 = pgVar12->p;
        }
        sVar18 = sVar17 + 1;
        pgVar12->n = sVar18;
        ppgVar13[sVar17] = pgVar14;
        ppgVar13 = pgVar12->p;
        if (sVar18 == sVar16) {
          sVar17 = sVar16 * 2;
          if (sVar16 == 0) {
            sVar17 = 8;
          }
          pgVar12->m = sVar17;
          ppgVar13 = (gnode_t **)realloc(ppgVar13,sVar17 << 3);
          pgVar12->p = ppgVar13;
          sVar18 = pgVar12->n;
        }
        pgVar12->n = sVar18 + 1;
        ppgVar13[sVar18] = pgVar8;
        gravity_lexer_token(lexer);
        sVar17 = parser->declarations->n;
        if (sVar17 == 0) {
          pgVar8 = (gnode_t *)0x0;
        }
        else {
          pgVar8 = parser->declarations->p[sVar17 - 1];
        }
        token_05.colno = uStack_188;
        token_05._0_8_ = local_190;
        token_05.position = iStack_184;
        token_05.bytes = (int)local_180;
        token_05.length = uVar20;
        token_05.fileid = (int)uStack_178;
        token_05.builtin = uVar21;
        token_05.value = local_170;
        pgVar8 = gnode_block_stat_create
                           (NODE_COMPOUND_STAT,token_05,pgVar12,pgVar8,
                            (iStack_12c + iStack_134) - iStack_184);
LAB_00111f40:
        parse_required(parser,TOK_OP_CLOSED_CURLYBRACE);
        uVar15 = 1;
      }
      else {
        pgVar8 = (gnode_t *)0x0;
        uVar15 = 0;
      }
      sVar17 = parser->declarations->n;
      if (sVar17 == 0) {
        pgVar14 = (gnode_t *)0x0;
      }
      else {
        pgVar14 = parser->declarations->p[sVar17 - 1];
      }
      token_06.colno = (int)uStack_160;
      token_06.type = (undefined4)local_168;
      token_06.lineno = local_168._4_4_;
      token_06.position = (int)((ulong)uStack_160 >> 0x20);
      token_06.bytes = (int)local_158;
      token_06.length = (int)((ulong)local_158 >> 0x20);
      token_06.fileid = (int)uStack_150;
      token_06.builtin = (int)((ulong)uStack_150 >> 0x20);
      token_06.value = local_148;
      pgVar8 = gnode_variable_create(token_06,pcVar7,annotation_type,pgVar8,pgVar14,vdecl);
      if (pgVar8 != (gnode_t *)0x0) {
        *(undefined1 *)((long)&pgVar8[1].token.length + 3) = uVar15;
        sVar17 = pgVar6->n;
        ppgVar13 = pgVar6->p;
        if (sVar17 == pgVar6->m) {
          sVar16 = sVar17 * 2;
          if (sVar17 == 0) {
            sVar16 = 8;
          }
          pgVar6->m = sVar16;
          ppgVar13 = (gnode_t **)realloc(ppgVar13,sVar16 << 3);
          pgVar6->p = ppgVar13;
          sVar17 = pgVar6->n;
        }
        pgVar6->n = sVar17 + 1;
        ppgVar13[sVar17] = pgVar8;
      }
      gVar4 = gravity_lexer_peek(pgVar1);
      if (gVar4 != TOK_OP_COMMA) {
        if (isstatement) {
          pgVar1 = parser->lexer->p[parser->lexer->n - 1];
          gVar4 = gravity_lexer_peek(pgVar1);
          if (gVar4 == TOK_OP_SEMICOLON) {
            gravity_lexer_next(pgVar1);
          }
        }
        vdecl->decls = pgVar6;
        return &vdecl->base;
      }
      gravity_lexer_next(pgVar1);
      pcVar7 = parse_identifier(parser);
    }
  }
  else {
    gravity_lexer_token(pgVar1);
    pcVar7 = token_name(gVar4);
    report_error(parser,GRAVITY_ERROR_SYNTAX,0x13fcb6,pcVar7);
  }
  return (gnode_t *)0x0;
}

Assistant:

static gnode_t *parse_variable_declaration (gravity_parser_t *parser, bool isstatement, gtoken_t access_specifier, gtoken_t storage_specifier) {
    DEBUG_PARSER("parse_variable_declaration");
    DECLARE_LEXER;

    gnode_r *decls = NULL;
    gnode_t *decl = NULL;
    gnode_t *expr = NULL;
    const char *identifier = NULL;
    const char *type_annotation = NULL;
    gtoken_t type;
    gtoken_t peek;
    gtoken_s token, token2;

    // access_specifier? storage_specifier? variable_declaration ';'
    // variable_declaration: variable_declarator decl_item
    // variable_declarator: 'const' | 'var'
    // decl_item: (IDENTIFIER assignment?) (',' IDENTIFIER assignment?)*
    // assignment

    // sanity check on variable type
    type = gravity_lexer_next(lexer);
    if (!token_isvariable_declaration(type)) {
        REPORT_ERROR(gravity_lexer_token(lexer), "VAR or CONST expected here but found %s.", token_name(type));
        return NULL;
    }
    token = gravity_lexer_token(lexer);

    // create node variable declaration
    gnode_variable_decl_t *node = (gnode_variable_decl_t *) gnode_variable_decl_create(token, type, access_specifier, storage_specifier, NULL, LAST_DECLARATION());

    // initialize node array
    decls = gnode_array_create();

loop:
    identifier = parse_identifier(parser);
    if (!identifier) return NULL;
    token2 = gravity_lexer_token(lexer);

    // type annotation is optional so it can be NULL
    type_annotation = parse_optional_type_annotation(parser);
    DEBUG_PARSER("IDENTIFIER: %s %s", identifier, (type_annotation) ? type_annotation : "");
    if (type_annotation && parser->delegate && parser->delegate->type_callback) {
        parser->delegate->type_callback(&token2, type_annotation, parser->delegate->xdata);
    }

    // check for optional assignment or getter/setter declaration (ONLY = is ALLOWED here!)
    expr = NULL;
    bool is_computed = false;
    peek = gravity_lexer_peek(lexer);
    if (token_isvariable_assignment(peek)) {
        gravity_lexer_next(lexer); // consume ASSIGNMENT
        marray_push(uint16_t, parser->vdecl, 1);
        expr = parse_expression(parser);
        marray_pop(parser->vdecl);
    } else if (peek == TOK_OP_OPEN_CURLYBRACE) {
        gravity_lexer_next(lexer); // consume TOK_OP_OPEN_CURLYBRACE
        expr = parse_getter_setter(parser);
        parse_required(parser, TOK_OP_CLOSED_CURLYBRACE);
        is_computed = true;
    }

    // sanity checks
    // 1. CONST must be followed by an assignment expression ?
    // 2. check if identifier is unique inside variable declarations

    decl = gnode_variable_create(token2, identifier, type_annotation, expr, LAST_DECLARATION(), node);
    if (decl) {
        ((gnode_var_t *)decl)->iscomputed = is_computed;
        gnode_array_push(decls, decl);
    }

    peek = gravity_lexer_peek(lexer);
    if (peek == TOK_OP_COMMA) {
        gravity_lexer_next(lexer); // consume TOK_OP_COMMA
        goto loop;
    }

    // check and consume TOK_OP_SEMICOLON (ALWAYS required for assignments)
    // Aaron: I would keep it consistent, even if it's not strictly required.
    // Otherwise we end up with all of JavaScript's terrible ideas. ;-)
    // So I would require the semicolon at the end of any assignment statement.
    if (isstatement) parse_semicolon(parser);

    // finish to setup declaration
    node->decls = decls;

    return (gnode_t *)node;
}